

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O3

int cmime_message_set_body(CMimeMessage_T *message,char *content)

{
  int iVar1;
  CMimePart_T *pCVar2;
  CMimeInfo_T *mi;
  char *pcVar3;
  int iVar4;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x456,"int cmime_message_set_body(CMimeMessage_T *, const char *)");
  }
  if (content != (char *)0x0) {
    iVar1 = message->parts->size;
    iVar4 = -1;
    if (message->boundary == (char *)0x0 || iVar1 < 2) {
      if (iVar1 == 1) {
        pCVar2 = (CMimePart_T *)cmime_list_pop_head(message->parts);
        cmime_part_free(pCVar2);
      }
      mi = cmime_util_info_get_from_string(content);
      if (mi != (CMimeInfo_T *)0x0) {
        if (mi->combined != (char *)0x0) {
          _cmime_internal_set_linked_header_value(message->headers,"Content-Type",mi->combined);
        }
        cmime_util_info_free(mi);
      }
      pCVar2 = cmime_part_new();
      cmime_part_set_content(pCVar2,content);
      cmime_list_append(message->parts,pCVar2);
      iVar4 = 0;
      if (message->gap == (char *)0x0) {
        pcVar3 = message->linebreak;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "\r\n";
        }
        pcVar3 = strdup(pcVar3);
        message->gap = pcVar3;
        iVar4 = 0;
      }
    }
    return iVar4;
  }
  __assert_fail("content",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x457,"int cmime_message_set_body(CMimeMessage_T *, const char *)");
}

Assistant:

int cmime_message_set_body(CMimeMessage_T *message, const char *content) {
    CMimePart_T *p = NULL;
    CMimeInfo_T *mi = NULL;

    assert(message);
    assert(content);  

    /* check if message object has a boundary and more the 1 mime parts */ 
    if ((message->boundary != NULL) && (message->parts->size > 1))
        return(-1);

    if (message->parts->size == 1) {
        p = (CMimePart_T *)cmime_list_pop_head(message->parts);
        cmime_part_free(p);
    }
    
    mi = cmime_util_info_get_from_string(content);
    if (mi!=NULL) {
        if (mi->combined != NULL)
            cmime_message_set_content_type(message, mi->combined);

        cmime_util_info_free(mi);
    }

    p = cmime_part_new();    
    cmime_part_set_content(p,content);
    cmime_list_append(message->parts,p);

    /* check message gap */
    if (message->gap == NULL) {
        if (message->linebreak != NULL)
            message->gap = strdup(message->linebreak);
        else
            message->gap = strdup(CRLF);
    }

    return(0);
}